

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O0

void __thiscall TreeItem::~TreeItem(TreeItem *this)

{
  TreeItem *this_00;
  bool bVar1;
  reference ppTVar2;
  _Self local_20;
  _Self local_18;
  iterator begin;
  TreeItem *this_local;
  
  begin._M_node = (_List_node_base *)this;
  local_18._M_node =
       (_List_node_base *)
       std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::begin(&this->childItems);
  while( true ) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::end(&this->childItems);
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = std::_List_iterator<TreeItem_*>::operator*(&local_18);
    this_00 = *ppTVar2;
    if (this_00 != (TreeItem *)0x0) {
      ~TreeItem(this_00);
      operator_delete(this_00);
    }
    std::_List_iterator<TreeItem_*>::operator++(&local_18);
  }
  UByteArray::~UByteArray(&this->itemUncompressedData);
  UByteArray::~UByteArray(&this->itemParsingData);
  UByteArray::~UByteArray(&this->itemTail);
  UByteArray::~UByteArray(&this->itemBody);
  UByteArray::~UByteArray(&this->itemHeader);
  Bstrlib::CBString::~CBString(&this->itemInfo);
  Bstrlib::CBString::~CBString(&this->itemText);
  Bstrlib::CBString::~CBString(&this->itemName);
  std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::~list(&this->childItems);
  return;
}

Assistant:

TreeItem::~TreeItem() {
    std::list<TreeItem*>::iterator begin = childItems.begin();
    while (begin != childItems.end()) {
        delete *begin;
        ++begin;
    }
}